

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong
helper_muleq_s_pw_qhr_mips64el(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (((uint)rt & 0xffff0000) == 0x80000000 && ((uint)rs & 0xffff0000) == 0x80000000) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x20;
    uVar3 = 0x7fffffff00000000;
  }
  else {
    uVar3 = ((long)(int)(uint)rt & 0x7fffffff0000U) * 0x10000 *
            (ulong)((uint)((ulong)(long)(int)(uint)rs >> 0xf) & 0xfffffffe);
  }
  if ((short)rt == -0x8000 && (short)rs == -0x8000) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x20;
    uVar2 = 0x7fffffff;
  }
  else {
    uVar2 = (ulong)(uint)((int)(short)rs * (int)(short)rt * 2);
  }
  return uVar2 | uVar3;
}

Assistant:

static inline int32_t mipsdsp_mul_q15_q15(int32_t ac, uint16_t a, uint16_t b,
                                          CPUMIPSState *env)
{
    int32_t temp;

    if ((a == 0x8000) && (b == 0x8000)) {
        temp = 0x7FFFFFFF;
        set_DSPControl_overflow_flag(1, 16 + ac, env);
    } else {
        temp = ((int16_t)a * (int16_t)b) << 1;
    }

    return temp;
}